

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  undefined8 *puVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  Ref<embree::Geometry> *pRVar30;
  Geometry *pGVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  RTCFilterFunctionN p_Var39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar52;
  AABBNodeMB4D *node1;
  ulong uVar53;
  long lVar54;
  RTCRayN *pRVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  undefined4 uVar59;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  int iVar63;
  NodeRef *pNVar64;
  ulong uVar65;
  long lVar66;
  Scene *pSVar67;
  ulong uVar68;
  size_t sVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  ulong uVar74;
  ulong uVar75;
  bool bVar76;
  bool bVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar108;
  float fVar109;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar110;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [16];
  float fVar119;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  float fVar128;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar129;
  float fVar130;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [16];
  float fVar138;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar139;
  float fVar144;
  float fVar145;
  undefined1 auVar140 [16];
  float fVar146;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar150;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [16];
  float fVar156;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar169 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar200 [16];
  float fStack_cc0;
  float fStack_cbc;
  float fStack_cb0;
  float fStack_cac;
  undefined8 local_ca8;
  float fStack_c80;
  float fStack_c7c;
  undefined1 local_ba8 [16];
  undefined8 local_b98;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  Scene *scene;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined1 (*local_b00) [16];
  ulong local_af8;
  ulong local_af0;
  ulong local_ae8;
  ulong local_ae0;
  ulong local_ad8;
  NodeRef *local_ad0;
  RTCFilterFunctionNArguments args;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [8];
  float fStack_9c0;
  float fStack_9bc;
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_968;
  undefined4 uStack_964;
  undefined4 uStack_960;
  undefined4 uStack_95c;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  uint local_918;
  uint uStack_914;
  uint uStack_910;
  uint uStack_90c;
  uint local_908;
  uint uStack_904;
  uint uStack_900;
  uint uStack_8fc;
  uint local_8f8;
  uint uStack_8f4;
  uint uStack_8f0;
  uint uStack_8ec;
  undefined1 local_8e8 [16];
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 local_858;
  undefined8 uStack_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar25 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar26 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar27 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar162 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar163 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar166 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar184 = fVar162 * 0.99999964;
  fVar196 = fVar163 * 0.99999964;
  fVar174 = fVar166 * 0.99999964;
  fVar162 = fVar162 * 1.0000004;
  fVar163 = fVar163 * 1.0000004;
  fVar166 = fVar166 * 1.0000004;
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar71 = uVar65 ^ 0x10;
  uVar60 = uVar68 ^ 0x10;
  uVar56 = uVar74 ^ 0x10;
  iVar63 = (tray->tnear).field_0.i[k];
  auVar131._4_4_ = iVar63;
  auVar131._0_4_ = iVar63;
  auVar131._8_4_ = iVar63;
  auVar131._12_4_ = iVar63;
  iVar63 = (tray->tfar).field_0.i[k];
  auVar140._4_4_ = iVar63;
  auVar140._0_4_ = iVar63;
  auVar140._8_4_ = iVar63;
  auVar140._12_4_ = iVar63;
  local_858 = mm_lookupmask_ps._0_8_;
  uStack_850 = mm_lookupmask_ps._8_8_;
  local_8e8 = mm_lookupmask_ps._240_16_;
  local_b00 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_ad0 = stack + 1;
  local_ca8 = k;
  fVar78 = fVar196;
  fVar201 = fVar196;
  local_af8 = uVar60;
  local_af0 = uVar71;
  local_ae8 = uVar74;
  local_ae0 = uVar68;
  local_ad8 = uVar65;
LAB_0029b3c6:
  pNVar64 = local_ad0;
  if (pNVar64 != stack) {
    local_ad0 = pNVar64 + -1;
    sVar69 = pNVar64[-1].ptr;
    do {
      if ((sVar69 & 8) == 0) {
        uVar53 = sVar69 & 0xfffffffffffffff0;
        fVar161 = *(float *)(ray + local_ca8 * 4 + 0x70);
        pfVar22 = (float *)(uVar53 + 0x80 + uVar65);
        pfVar20 = (float *)(uVar53 + 0x20 + uVar65);
        auVar122._0_4_ = ((*pfVar22 * fVar161 + *pfVar20) - fVar25) * fVar184;
        auVar122._4_4_ = ((pfVar22[1] * fVar161 + pfVar20[1]) - fVar25) * fVar184;
        auVar122._8_4_ = ((pfVar22[2] * fVar161 + pfVar20[2]) - fVar25) * fVar184;
        auVar122._12_4_ = ((pfVar22[3] * fVar161 + pfVar20[3]) - fVar25) * fVar184;
        pfVar22 = (float *)(uVar53 + 0x80 + uVar68);
        pfVar20 = (float *)(uVar53 + 0x20 + uVar68);
        auVar91 = maxps(auVar131,auVar122);
        auVar121._0_4_ = ((*pfVar22 * fVar161 + *pfVar20) - fVar26) * fVar78;
        auVar121._4_4_ = ((pfVar22[1] * fVar161 + pfVar20[1]) - fVar26) * fVar201;
        auVar121._8_4_ = ((pfVar22[2] * fVar161 + pfVar20[2]) - fVar26) * fVar196;
        auVar121._12_4_ = ((pfVar22[3] * fVar161 + pfVar20[3]) - fVar26) * fVar196;
        pfVar22 = (float *)(uVar53 + 0x80 + uVar74);
        pfVar20 = (float *)(uVar53 + 0x20 + uVar74);
        auVar112._0_4_ = ((*pfVar22 * fVar161 + *pfVar20) - fVar27) * fVar174;
        auVar112._4_4_ = ((pfVar22[1] * fVar161 + pfVar20[1]) - fVar27) * fVar174;
        auVar112._8_4_ = ((pfVar22[2] * fVar161 + pfVar20[2]) - fVar27) * fVar174;
        auVar112._12_4_ = ((pfVar22[3] * fVar161 + pfVar20[3]) - fVar27) * fVar174;
        auVar122 = maxps(auVar121,auVar112);
        auVar122 = maxps(auVar91,auVar122);
        pfVar22 = (float *)(uVar53 + 0x80 + uVar71);
        pfVar20 = (float *)(uVar53 + 0x20 + uVar71);
        auVar123._0_4_ = ((*pfVar22 * fVar161 + *pfVar20) - fVar25) * fVar162;
        auVar123._4_4_ = ((pfVar22[1] * fVar161 + pfVar20[1]) - fVar25) * fVar162;
        auVar123._8_4_ = ((pfVar22[2] * fVar161 + pfVar20[2]) - fVar25) * fVar162;
        auVar123._12_4_ = ((pfVar22[3] * fVar161 + pfVar20[3]) - fVar25) * fVar162;
        auVar112 = minps(auVar140,auVar123);
        pfVar23 = (float *)(uVar53 + 0x80 + uVar60);
        pfVar20 = (float *)(uVar53 + 0x20 + uVar60);
        pfVar24 = (float *)(uVar53 + 0x80 + uVar56);
        pfVar22 = (float *)(uVar53 + 0x20 + uVar56);
        auVar124._0_4_ = ((*pfVar23 * fVar161 + *pfVar20) - fVar26) * fVar163;
        auVar124._4_4_ = ((pfVar23[1] * fVar161 + pfVar20[1]) - fVar26) * fVar163;
        auVar124._8_4_ = ((pfVar23[2] * fVar161 + pfVar20[2]) - fVar26) * fVar163;
        auVar124._12_4_ = ((pfVar23[3] * fVar161 + pfVar20[3]) - fVar26) * fVar163;
        auVar91._4_4_ = ((pfVar24[1] * fVar161 + pfVar22[1]) - fVar27) * fVar166;
        auVar91._0_4_ = ((*pfVar24 * fVar161 + *pfVar22) - fVar27) * fVar166;
        auVar91._8_4_ = ((pfVar24[2] * fVar161 + pfVar22[2]) - fVar27) * fVar166;
        auVar91._12_4_ = ((pfVar24[3] * fVar161 + pfVar22[3]) - fVar27) * fVar166;
        auVar91 = minps(auVar124,auVar91);
        auVar91 = minps(auVar112,auVar91);
        bVar76 = auVar122._0_4_ <= auVar91._0_4_;
        bVar77 = auVar122._4_4_ <= auVar91._4_4_;
        bVar40 = auVar122._8_4_ <= auVar91._8_4_;
        bVar41 = auVar122._12_4_ <= auVar91._12_4_;
        if (((uint)sVar69 & 7) == 6) {
          bVar76 = (fVar161 < *(float *)(uVar53 + 0xf0) && *(float *)(uVar53 + 0xe0) <= fVar161) &&
                   bVar76;
          bVar77 = (fVar161 < *(float *)(uVar53 + 0xf4) && *(float *)(uVar53 + 0xe4) <= fVar161) &&
                   bVar77;
          bVar40 = (fVar161 < *(float *)(uVar53 + 0xf8) && *(float *)(uVar53 + 0xe8) <= fVar161) &&
                   bVar40;
          bVar41 = (fVar161 < *(float *)(uVar53 + 0xfc) && *(float *)(uVar53 + 0xec) <= fVar161) &&
                   bVar41;
        }
        auVar92._0_4_ = (uint)bVar76 * -0x80000000;
        auVar92._4_4_ = (uint)bVar77 * -0x80000000;
        auVar92._8_4_ = (uint)bVar40 * -0x80000000;
        auVar92._12_4_ = (uint)bVar41 * -0x80000000;
        uVar59 = movmskps((int)unaff_RBX,auVar92);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar59);
      }
      if ((sVar69 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar73 = 4;
        }
        else {
          uVar53 = sVar69 & 0xfffffffffffffff0;
          lVar58 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
            }
          }
          uVar73 = 0;
          sVar69 = *(size_t *)(uVar53 + lVar58 * 8);
          uVar57 = unaff_RBX - 1 & unaff_RBX;
          if (uVar57 != 0) {
            local_ad0->ptr = sVar69;
            lVar58 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
              }
            }
            uVar70 = uVar57 - 1;
            while( true ) {
              local_ad0 = local_ad0 + 1;
              sVar69 = *(size_t *)(uVar53 + lVar58 * 8);
              uVar70 = uVar70 & uVar57;
              if (uVar70 == 0) break;
              local_ad0->ptr = sVar69;
              lVar58 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                }
              }
              uVar57 = uVar70 - 1;
            }
          }
        }
      }
      else {
        uVar73 = 6;
      }
    } while (uVar73 == 0);
    if (uVar73 == 6) {
      uVar53 = (ulong)((uint)sVar69 & 0xf);
      uVar73 = 0;
      uVar57 = uVar53 - 8;
      bVar76 = uVar53 != 8;
      if (bVar76) {
        uVar70 = sVar69 & 0xfffffffffffffff0;
        uVar53 = 0;
        do {
          lVar58 = uVar53 * 0x60;
          pSVar67 = context->scene;
          pRVar30 = (pSVar67->geometries).items;
          pGVar31 = pRVar30[*(uint *)(uVar70 + 0x40 + lVar58)].ptr;
          fVar78 = (pGVar31->time_range).lower;
          local_868 = ((*(float *)(ray + local_ca8 * 4 + 0x70) - fVar78) /
                      ((pGVar31->time_range).upper - fVar78)) * pGVar31->fnumTimeSegments;
          auVar93 = roundss(ZEXT416((uint)fVar78),ZEXT416((uint)local_868),9);
          fVar78 = pGVar31->fnumTimeSegments + -1.0;
          if (fVar78 <= auVar93._0_4_) {
            auVar93._0_4_ = fVar78;
          }
          fVar78 = 0.0;
          if (0.0 <= auVar93._0_4_) {
            fVar78 = auVar93._0_4_;
          }
          local_868 = local_868 - fVar78;
          lVar66 = (long)(int)fVar78 * 0x38;
          lVar32 = *(long *)(*(long *)&pGVar31[2].numPrimitives + lVar66);
          uVar68 = (ulong)*(uint *)(uVar70 + 4 + lVar58);
          pfVar20 = (float *)(lVar32 + (ulong)*(uint *)(uVar70 + lVar58) * 4);
          uVar60 = (ulong)*(uint *)(uVar70 + 0x10 + lVar58);
          pfVar22 = (float *)(lVar32 + uVar60 * 4);
          uVar71 = (ulong)*(uint *)(uVar70 + 0x30 + lVar58);
          pfVar23 = (float *)(lVar32 + uVar71 * 4);
          lVar33 = *(long *)&pRVar30[*(uint *)(uVar70 + 0x44 + lVar58)].ptr[2].numPrimitives;
          lVar34 = *(long *)(lVar33 + lVar66);
          pfVar24 = (float *)(lVar34 + uVar68 * 4);
          uVar65 = (ulong)*(uint *)(uVar70 + 0x14 + lVar58);
          pfVar1 = (float *)(lVar34 + uVar65 * 4);
          lVar54 = (long)((int)fVar78 + 1) * 0x38;
          lVar35 = *(long *)(*(long *)&pGVar31[2].numPrimitives + lVar54);
          pfVar2 = (float *)(lVar35 + (ulong)*(uint *)(uVar70 + lVar58) * 4);
          uVar75 = (ulong)*(uint *)(uVar70 + 0x34 + lVar58);
          pfVar3 = (float *)(lVar34 + uVar75 * 4);
          lVar36 = *(long *)&pRVar30[*(uint *)(uVar70 + 0x48 + lVar58)].ptr[2].numPrimitives;
          uVar48 = *(undefined8 *)(lVar35 + uVar60 * 4 + 8);
          lVar37 = *(long *)(lVar36 + lVar66);
          lVar38 = *(long *)(lVar33 + lVar54);
          pfVar4 = (float *)(lVar38 + uVar68 * 4);
          uVar60 = (ulong)*(uint *)(uVar70 + 8 + lVar58);
          pfVar5 = (float *)(lVar37 + uVar60 * 4);
          lVar36 = *(long *)(lVar36 + lVar54);
          pfVar6 = (float *)(lVar36 + uVar60 * 4);
          uVar72 = (ulong)*(uint *)(uVar70 + 0x18 + lVar58);
          pfVar7 = (float *)(lVar37 + uVar72 * 4);
          lVar33 = *(long *)&pRVar30[*(uint *)(uVar70 + 0x4c + lVar58)].ptr[2].numPrimitives;
          uVar60 = *(ulong *)(lVar33 + lVar66);
          lVar54 = *(long *)(lVar33 + lVar54);
          uVar61 = (ulong)*(uint *)(uVar70 + 0x38 + lVar58);
          pfVar8 = (float *)(lVar37 + uVar61 * 4);
          fVar78 = pfVar8[2];
          uVar68 = (ulong)*(uint *)(uVar70 + 0xc + lVar58);
          pfVar9 = (float *)(uVar60 + uVar68 * 4);
          uVar74 = (ulong)*(uint *)(uVar70 + 0x1c + lVar58);
          pfVar10 = (float *)(uVar60 + uVar74 * 4);
          uVar62 = (ulong)*(uint *)(uVar70 + 0x3c + lVar58);
          pfVar11 = (float *)(uVar60 + uVar62 * 4);
          fVar201 = pfVar11[2];
          pfVar12 = (float *)(lVar54 + uVar68 * 4);
          pfVar13 = (float *)(lVar36 + uVar72 * 4);
          fStack_cb0 = (float)uVar48;
          pfVar14 = (float *)(lVar38 + uVar65 * 4);
          pfVar15 = (float *)(lVar54 + uVar74 * 4);
          local_ca8 = CONCAT44(pfVar15[2],pfVar13[2]);
          pfVar16 = (float *)(lVar35 + uVar71 * 4);
          pfVar17 = (float *)(lVar36 + uVar61 * 4);
          pfVar18 = (float *)(lVar38 + uVar75 * 4);
          pfVar19 = (float *)(lVar54 + uVar62 * 4);
          local_8b8 = 1.0 - local_868;
          local_878 = *pfVar22 * local_8b8 + *pfVar5 * local_868;
          fStack_874 = *pfVar1 * local_8b8 + *pfVar14 * local_868;
          fStack_870 = *pfVar7 * local_8b8 + *pfVar13 * local_868;
          fStack_86c = *pfVar10 * local_8b8 + *pfVar15 * local_868;
          fStack_cac = (float)((ulong)uVar48 >> 0x20);
          local_888 = pfVar22[1] * local_8b8 + *pfVar9 * local_868;
          fStack_884 = pfVar1[1] * local_8b8 + pfVar14[1] * local_868;
          fStack_880 = pfVar7[1] * local_8b8 + pfVar13[1] * local_868;
          fStack_87c = pfVar10[1] * local_8b8 + pfVar15[1] * local_868;
          local_b28 = pfVar22[2] * local_8b8 + fStack_cb0 * local_868;
          fStack_b24 = pfVar1[2] * local_8b8 + pfVar14[2] * local_868;
          fStack_b20 = fStack_b20 * local_8b8 + fStack_cb0 * local_868;
          fStack_b1c = fStack_b1c * local_8b8 + fStack_cac * local_868;
          fStack_864 = local_868;
          fStack_860 = local_868;
          fStack_85c = local_868;
          local_8a8 = *pfVar23 * local_8b8 + *pfVar16 * local_868;
          fStack_8a4 = *pfVar3 * local_8b8 + *pfVar18 * local_868;
          fStack_8a0 = *pfVar8 * local_8b8 + *pfVar17 * local_868;
          fStack_89c = *pfVar11 * local_8b8 + *pfVar19 * local_868;
          local_898 = pfVar23[1] * local_8b8 + pfVar16[1] * local_868;
          fStack_894 = pfVar3[1] * local_8b8 + pfVar18[1] * local_868;
          fStack_890 = pfVar8[1] * local_8b8 + pfVar17[1] * local_868;
          fStack_88c = pfVar11[1] * local_8b8 + pfVar19[1] * local_868;
          fStack_8b4 = local_8b8;
          fStack_8b0 = local_8b8;
          fStack_8ac = local_8b8;
          fVar167 = pfVar23[2] * local_8b8 + pfVar16[2] * local_868;
          fVar170 = pfVar3[2] * local_8b8 + pfVar18[2] * local_868;
          fStack_c80 = fStack_c80 * local_8b8 + pfVar17[2] * local_868;
          fStack_c7c = fStack_c7c * local_8b8 + pfVar19[2] * local_868;
          fVar161 = *(float *)(ray + local_ca8 * 4);
          fVar110 = *(float *)(ray + local_ca8 * 4 + 0x10);
          fVar120 = (*pfVar20 * local_8b8 + *pfVar2 * local_868) - fVar161;
          fVar128 = (*pfVar24 * local_8b8 + *pfVar4 * local_868) - fVar161;
          fStack_cc0 = (fStack_cc0 * local_8b8 + *pfVar6 * local_868) - fVar161;
          fStack_cbc = (fStack_cbc * local_8b8 + *pfVar12 * local_868) - fVar161;
          fVar175 = (pfVar20[1] * local_8b8 + pfVar2[1] * local_868) - fVar110;
          fVar177 = (pfVar24[1] * local_8b8 + pfVar4[1] * local_868) - fVar110;
          fVar179 = (pfVar5[1] * local_8b8 + pfVar6[1] * local_868) - fVar110;
          fVar182 = (pfVar9[1] * local_8b8 + pfVar12[1] * local_868) - fVar110;
          fVar185 = local_878 - fVar161;
          fVar188 = fStack_874 - fVar161;
          fVar191 = fStack_870 - fVar161;
          fVar194 = fStack_86c - fVar161;
          fVar197 = local_888 - fVar110;
          fVar202 = fStack_884 - fVar110;
          fVar205 = fStack_880 - fVar110;
          fVar208 = fStack_87c - fVar110;
          fVar156 = local_8a8 - fVar161;
          fVar159 = fStack_8a4 - fVar161;
          fVar160 = fStack_8a0 - fVar161;
          fVar161 = fStack_89c - fVar161;
          fVar90 = local_898 - fVar110;
          fVar108 = fStack_894 - fVar110;
          fVar109 = fStack_890 - fVar110;
          fVar110 = fStack_88c - fVar110;
          fVar119 = *(float *)(ray + local_ca8 * 4 + 0x20);
          local_b18 = (pfVar7[2] * local_8b8 + pfVar2[2] * local_868) - fVar119;
          fStack_b14 = (pfVar10[2] * local_8b8 + pfVar4[2] * local_868) - fVar119;
          fStack_b10 = (pfVar5[2] * local_8b8 + pfVar6[2] * local_868) - fVar119;
          fStack_b0c = (pfVar9[2] * local_8b8 + pfVar12[2] * local_868) - fVar119;
          fVar139 = local_b28 - fVar119;
          fVar144 = fStack_b24 - fVar119;
          fVar145 = fStack_b20 - fVar119;
          fVar146 = fStack_b1c - fVar119;
          fVar111 = fVar167 - fVar119;
          fVar117 = fVar170 - fVar119;
          fVar118 = fStack_c80 - fVar119;
          fVar119 = fStack_c7c - fVar119;
          local_7e8 = fVar156 - fVar120;
          fStack_7e4 = fVar159 - fVar128;
          fStack_7e0 = fVar160 - fStack_cc0;
          fStack_7dc = fVar161 - fStack_cbc;
          local_808 = fVar90 - fVar175;
          fStack_804 = fVar108 - fVar177;
          fStack_800 = fVar109 - fVar179;
          fStack_7fc = fVar110 - fVar182;
          local_7f8 = fVar111 - local_b18;
          fStack_7f4 = fVar117 - fStack_b14;
          fStack_7f0 = fVar118 - fStack_b10;
          fStack_7ec = fVar119 - fStack_b0c;
          fVar150 = *(float *)(ray + local_ca8 * 4 + 0x50);
          fVar129 = *(float *)(ray + local_ca8 * 4 + 0x60);
          fStack_b40 = *(float *)(ray + local_ca8 * 4 + 0x40);
          fVar168 = (local_808 * (fVar111 + local_b18) - (fVar90 + fVar175) * local_7f8) *
                    fStack_b40 +
                    ((fVar156 + fVar120) * local_7f8 - (fVar111 + local_b18) * local_7e8) * fVar150
                    + (local_7e8 * (fVar90 + fVar175) - (fVar156 + fVar120) * local_808) * fVar129;
          fVar171 = (fStack_804 * (fVar117 + fStack_b14) - (fVar108 + fVar177) * fStack_7f4) *
                    fStack_b40 +
                    ((fVar159 + fVar128) * fStack_7f4 - (fVar117 + fStack_b14) * fStack_7e4) *
                    fVar150 + (fStack_7e4 * (fVar108 + fVar177) - (fVar159 + fVar128) * fStack_804)
                              * fVar129;
          fVar172 = (fStack_800 * (fVar118 + fStack_b10) - (fVar109 + fVar179) * fStack_7f0) *
                    fStack_b40 +
                    ((fVar160 + fStack_cc0) * fStack_7f0 - (fVar118 + fStack_b10) * fStack_7e0) *
                    fVar150 + (fStack_7e0 * (fVar109 + fVar179) -
                              (fVar160 + fStack_cc0) * fStack_800) * fVar129;
          fVar173 = (fStack_7fc * (fVar119 + fStack_b0c) - (fVar110 + fVar182) * fStack_7ec) *
                    fStack_b40 +
                    ((fVar161 + fStack_cbc) * fStack_7ec - (fVar119 + fStack_b0c) * fStack_7dc) *
                    fVar150 + (fStack_7dc * (fVar110 + fVar182) -
                              (fVar161 + fStack_cbc) * fStack_7fc) * fVar129;
          fVar151 = fVar120 - fVar185;
          fVar153 = fVar128 - fVar188;
          fVar154 = fStack_cc0 - fVar191;
          fVar155 = fStack_cbc - fVar194;
          fVar176 = fVar175 - fVar197;
          fVar178 = fVar177 - fVar202;
          fVar180 = fVar179 - fVar205;
          fVar183 = fVar182 - fVar208;
          local_818 = local_b18 - fVar139;
          fStack_814 = fStack_b14 - fVar144;
          fStack_810 = fStack_b10 - fVar145;
          fStack_80c = fStack_b0c - fVar146;
          local_838 = (fVar176 * (local_b18 + fVar139) - (fVar175 + fVar197) * local_818) *
                      fStack_b40 +
                      ((fVar120 + fVar185) * local_818 - (local_b18 + fVar139) * fVar151) * fVar150
                      + (fVar151 * (fVar175 + fVar197) - (fVar120 + fVar185) * fVar176) * fVar129;
          fStack_834 = (fVar178 * (fStack_b14 + fVar144) - (fVar177 + fVar202) * fStack_814) *
                       fStack_b40 +
                       ((fVar128 + fVar188) * fStack_814 - (fStack_b14 + fVar144) * fVar153) *
                       fVar150 + (fVar153 * (fVar177 + fVar202) - (fVar128 + fVar188) * fVar178) *
                                 fVar129;
          fStack_830 = (fVar180 * (fStack_b10 + fVar145) - (fVar179 + fVar205) * fStack_810) *
                       fStack_b40 +
                       ((fStack_cc0 + fVar191) * fStack_810 - (fStack_b10 + fVar145) * fVar154) *
                       fVar150 + (fVar154 * (fVar179 + fVar205) - (fStack_cc0 + fVar191) * fVar180)
                                 * fVar129;
          fStack_82c = (fVar183 * (fStack_b0c + fVar146) - (fVar182 + fVar208) * fStack_80c) *
                       fStack_b40 +
                       ((fStack_cbc + fVar194) * fStack_80c - (fStack_b0c + fVar146) * fVar155) *
                       fVar150 + (fVar155 * (fVar182 + fVar208) - (fStack_cbc + fVar194) * fVar183)
                                 * fVar129;
          fVar130 = fVar185 - fVar156;
          fVar136 = fVar188 - fVar159;
          fVar137 = fVar191 - fVar160;
          fVar138 = fVar194 - fVar161;
          fVar198 = fVar197 - fVar90;
          fVar203 = fVar202 - fVar108;
          fVar206 = fVar205 - fVar109;
          fVar209 = fVar208 - fVar110;
          fVar186 = fVar139 - fVar111;
          fVar189 = fVar144 - fVar117;
          fVar192 = fVar145 - fVar118;
          fVar195 = fVar146 - fVar119;
          auVar125._0_4_ =
               (fVar198 * (fVar111 + fVar139) - (fVar90 + fVar197) * fVar186) * fStack_b40 +
               ((fVar156 + fVar185) * fVar186 - (fVar111 + fVar139) * fVar130) * fVar150 +
               (fVar130 * (fVar90 + fVar197) - (fVar156 + fVar185) * fVar198) * fVar129;
          auVar125._4_4_ =
               (fVar203 * (fVar117 + fVar144) - (fVar108 + fVar202) * fVar189) * fStack_b40 +
               ((fVar159 + fVar188) * fVar189 - (fVar117 + fVar144) * fVar136) * fVar150 +
               (fVar136 * (fVar108 + fVar202) - (fVar159 + fVar188) * fVar203) * fVar129;
          auVar125._8_4_ =
               (fVar206 * (fVar118 + fVar145) - (fVar109 + fVar205) * fVar192) * fStack_b40 +
               ((fVar160 + fVar191) * fVar192 - (fVar118 + fVar145) * fVar137) * fVar150 +
               (fVar137 * (fVar109 + fVar205) - (fVar160 + fVar191) * fVar206) * fVar129;
          auVar125._12_4_ =
               (fVar209 * (fVar119 + fVar146) - (fVar110 + fVar208) * fVar195) * fStack_b40 +
               ((fVar161 + fVar194) * fVar195 - (fVar119 + fVar146) * fVar138) * fVar150 +
               (fVar138 * (fVar110 + fVar208) - (fVar161 + fVar194) * fVar209) * fVar129;
          local_848 = fVar168 + local_838 + auVar125._0_4_;
          fStack_844 = fVar171 + fStack_834 + auVar125._4_4_;
          fStack_840 = fVar172 + fStack_830 + auVar125._8_4_;
          fStack_83c = fVar173 + fStack_82c + auVar125._12_4_;
          auVar79._8_4_ = fVar172;
          auVar79._0_8_ = CONCAT44(fVar171,fVar168);
          auVar79._12_4_ = fVar173;
          auVar42._4_4_ = fStack_834;
          auVar42._0_4_ = local_838;
          auVar42._8_4_ = fStack_830;
          auVar42._12_4_ = fStack_82c;
          auVar91 = minps(auVar79,auVar42);
          auVar91 = minps(auVar91,auVar125);
          auVar141._8_4_ = fVar172;
          auVar141._0_8_ = CONCAT44(fVar171,fVar168);
          auVar141._12_4_ = fVar173;
          auVar43._4_4_ = fStack_834;
          auVar43._0_4_ = local_838;
          auVar43._8_4_ = fStack_830;
          auVar43._12_4_ = fStack_82c;
          auVar122 = maxps(auVar141,auVar43);
          auVar122 = maxps(auVar122,auVar125);
          fVar161 = ABS(local_848) * 1.1920929e-07;
          fVar110 = ABS(fStack_844) * 1.1920929e-07;
          fVar119 = ABS(fStack_840) * 1.1920929e-07;
          fVar90 = ABS(fStack_83c) * 1.1920929e-07;
          auVar142._4_4_ = -(uint)(auVar122._4_4_ <= fVar110);
          auVar142._0_4_ = -(uint)(auVar122._0_4_ <= fVar161);
          auVar142._8_4_ = -(uint)(auVar122._8_4_ <= fVar119);
          auVar142._12_4_ = -(uint)(auVar122._12_4_ <= fVar90);
          auVar80._4_4_ = -(uint)(-fVar110 <= auVar91._4_4_);
          auVar80._0_4_ = -(uint)(-fVar161 <= auVar91._0_4_);
          auVar80._8_4_ = -(uint)(-fVar119 <= auVar91._8_4_);
          auVar80._12_4_ = -(uint)(-fVar90 <= auVar91._12_4_);
          auVar142 = auVar142 | auVar80;
          lVar33 = uVar70 + lVar58;
          uVar65 = (ulong)*(uint *)(uVar70 + 0x20 + lVar58);
          uVar68 = (ulong)*(uint *)(uVar70 + 0x24 + lVar58);
          uVar74 = (ulong)*(uint *)(uVar70 + 0x28 + lVar58);
          uVar71 = (ulong)*(uint *)(uVar70 + 0x2c + lVar58);
          iVar63 = movmskps((int)uVar60,auVar142);
          puVar21 = (undefined8 *)(lVar32 + uVar65 * 4);
          uVar48 = *puVar21;
          uVar49 = puVar21[1];
          pfVar20 = (float *)(lVar35 + uVar65 * 4);
          local_b98._0_4_ = *pfVar20;
          local_b98._4_4_ = pfVar20[1];
          fStack_b90 = pfVar20[2];
          fStack_b8c = pfVar20[3];
          puVar21 = (undefined8 *)(lVar34 + uVar68 * 4);
          local_8c8 = *puVar21;
          uStack_8c0 = puVar21[1];
          puVar21 = (undefined8 *)(lVar38 + uVar68 * 4);
          local_b88 = *puVar21;
          uStack_b80 = puVar21[1];
          puVar21 = (undefined8 *)(lVar37 + uVar74 * 4);
          local_8d8 = *puVar21;
          uStack_8d0 = puVar21[1];
          puVar21 = (undefined8 *)(lVar36 + uVar74 * 4);
          local_b78 = *puVar21;
          uStack_b70 = puVar21[1];
          puVar21 = (undefined8 *)(uVar60 + uVar71 * 4);
          local_b68 = *puVar21;
          uStack_b60 = puVar21[1];
          puVar21 = (undefined8 *)(lVar54 + uVar71 * 4);
          local_b58 = *puVar21;
          uStack_b50 = puVar21[1];
          if (iVar63 != 0) {
            local_828 = fVar198;
            fStack_824 = fVar203;
            fStack_820 = fVar206;
            fStack_81c = fVar209;
            _local_b48 = CONCAT44(fStack_b40,fStack_b40);
            auVar164._0_4_ = fVar176 * fVar186 - fVar198 * local_818;
            auVar164._4_4_ = fVar178 * fVar189 - fVar203 * fStack_814;
            auVar164._8_4_ = fVar180 * fVar192 - fVar206 * fStack_810;
            auVar164._12_4_ = fVar183 * fVar195 - fVar209 * fStack_80c;
            auVar81._4_4_ = -(uint)(ABS(fVar178 * fStack_7f4) < ABS(fVar203 * fStack_814));
            auVar81._0_4_ = -(uint)(ABS(fVar176 * local_7f8) < ABS(fVar198 * local_818));
            auVar81._8_4_ = -(uint)(ABS(fVar180 * fStack_7f0) < ABS(fVar206 * fStack_810));
            auVar81._12_4_ = -(uint)(ABS(fVar183 * fStack_7ec) < ABS(fVar209 * fStack_80c));
            auVar45._4_4_ = fStack_804 * fStack_814 - fVar178 * fStack_7f4;
            auVar45._0_4_ = local_808 * local_818 - fVar176 * local_7f8;
            auVar45._8_4_ = fStack_800 * fStack_810 - fVar180 * fStack_7f0;
            auVar45._12_4_ = fStack_7fc * fStack_80c - fVar183 * fStack_7ec;
            local_9b8 = blendvps(auVar164,auVar45,auVar81);
            auVar132._0_4_ = fVar130 * local_818 - fVar151 * fVar186;
            auVar132._4_4_ = fVar136 * fStack_814 - fVar153 * fVar189;
            auVar132._8_4_ = fVar137 * fStack_810 - fVar154 * fVar192;
            auVar132._12_4_ = fVar138 * fStack_80c - fVar155 * fVar195;
            auVar82._4_4_ = -(uint)(ABS(fStack_7e4 * fStack_814) < ABS(fVar153 * fVar189));
            auVar82._0_4_ = -(uint)(ABS(local_7e8 * local_818) < ABS(fVar151 * fVar186));
            auVar82._8_4_ = -(uint)(ABS(fStack_7e0 * fStack_810) < ABS(fVar154 * fVar192));
            auVar82._12_4_ = -(uint)(ABS(fStack_7dc * fStack_80c) < ABS(fVar155 * fVar195));
            auVar47._4_4_ = fStack_7f4 * fVar153 - fStack_7e4 * fStack_814;
            auVar47._0_4_ = local_7f8 * fVar151 - local_7e8 * local_818;
            auVar47._8_4_ = fStack_7f0 * fVar154 - fStack_7e0 * fStack_810;
            auVar47._12_4_ = fStack_7ec * fVar155 - fStack_7dc * fStack_80c;
            local_9a8 = blendvps(auVar132,auVar47,auVar82);
            auVar157._0_4_ = local_7e8 * fVar176 - fVar151 * local_808;
            auVar157._4_4_ = fStack_7e4 * fVar178 - fVar153 * fStack_804;
            auVar157._8_4_ = fStack_7e0 * fVar180 - fVar154 * fStack_800;
            auVar157._12_4_ = fStack_7dc * fVar183 - fVar155 * fStack_7fc;
            auVar152._0_4_ = fVar151 * fVar198 - fVar130 * fVar176;
            auVar152._4_4_ = fVar153 * fVar203 - fVar136 * fVar178;
            auVar152._8_4_ = fVar154 * fVar206 - fVar137 * fVar180;
            auVar152._12_4_ = fVar155 * fVar209 - fVar138 * fVar183;
            auVar83._4_4_ = -(uint)(ABS(fVar153 * fStack_804) < ABS(fVar136 * fVar178));
            auVar83._0_4_ = -(uint)(ABS(fVar151 * local_808) < ABS(fVar130 * fVar176));
            auVar83._8_4_ = -(uint)(ABS(fVar154 * fStack_800) < ABS(fVar137 * fVar180));
            auVar83._12_4_ = -(uint)(ABS(fVar155 * fStack_7fc) < ABS(fVar138 * fVar183));
            local_998 = blendvps(auVar152,auVar157,auVar83);
            fVar161 = fStack_b40 * local_9b8._0_4_ +
                      fVar150 * local_9a8._0_4_ + fVar129 * local_998._0_4_;
            fVar110 = fStack_b40 * local_9b8._4_4_ +
                      fVar150 * local_9a8._4_4_ + fVar129 * local_998._4_4_;
            fVar119 = fStack_b40 * local_9b8._8_4_ +
                      fVar150 * local_9a8._8_4_ + fVar129 * local_998._8_4_;
            fVar150 = fStack_b40 * local_9b8._12_4_ +
                      fVar150 * local_9a8._12_4_ + fVar129 * local_998._12_4_;
            auVar147._0_4_ = fVar161 + fVar161;
            auVar147._4_4_ = fVar110 + fVar110;
            auVar147._8_4_ = fVar119 + fVar119;
            auVar147._12_4_ = fVar150 + fVar150;
            auVar94._0_4_ = fVar175 * local_9a8._0_4_ + local_b18 * local_998._0_4_;
            auVar94._4_4_ = fVar177 * local_9a8._4_4_ + fStack_b14 * local_998._4_4_;
            auVar94._8_4_ = fVar179 * local_9a8._8_4_ + fStack_b10 * local_998._8_4_;
            auVar94._12_4_ = fVar182 * local_9a8._12_4_ + fStack_b0c * local_998._12_4_;
            fVar129 = fVar120 * local_9b8._0_4_ + auVar94._0_4_;
            fVar90 = fVar128 * local_9b8._4_4_ + auVar94._4_4_;
            fVar108 = fStack_cc0 * local_9b8._8_4_ + auVar94._8_4_;
            fVar109 = fStack_cbc * local_9b8._12_4_ + auVar94._12_4_;
            auVar91 = rcpps(auVar94,auVar147);
            fVar161 = auVar91._0_4_;
            fVar110 = auVar91._4_4_;
            fVar119 = auVar91._8_4_;
            fVar150 = auVar91._12_4_;
            local_9c8._0_4_ =
                 ((1.0 - auVar147._0_4_ * fVar161) * fVar161 + fVar161) * (fVar129 + fVar129);
            local_9c8._4_4_ =
                 ((1.0 - auVar147._4_4_ * fVar110) * fVar110 + fVar110) * (fVar90 + fVar90);
            fStack_9c0 = ((1.0 - auVar147._8_4_ * fVar119) * fVar119 + fVar119) *
                         (fVar108 + fVar108);
            fStack_9bc = ((1.0 - auVar147._12_4_ * fVar150) * fVar150 + fVar150) *
                         (fVar109 + fVar109);
            fVar161 = *(float *)(ray + local_ca8 * 4 + 0x80);
            fVar110 = *(float *)(ray + local_ca8 * 4 + 0x30);
            auVar113._4_4_ = -(uint)(fVar110 <= (float)local_9c8._4_4_);
            auVar113._0_4_ = -(uint)(fVar110 <= (float)local_9c8._0_4_);
            auVar113._8_4_ = -(uint)(fVar110 <= fStack_9c0);
            auVar113._12_4_ = -(uint)(fVar110 <= fStack_9bc);
            auVar95._0_4_ =
                 -(uint)((float)local_9c8._0_4_ <= fVar161 && fVar110 <= (float)local_9c8._0_4_) &
                 auVar142._0_4_;
            auVar95._4_4_ =
                 -(uint)((float)local_9c8._4_4_ <= fVar161 && fVar110 <= (float)local_9c8._4_4_) &
                 auVar142._4_4_;
            auVar95._8_4_ = -(uint)(fStack_9c0 <= fVar161 && fVar110 <= fStack_9c0) & auVar142._8_4_
            ;
            auVar95._12_4_ =
                 -(uint)(fStack_9bc <= fVar161 && fVar110 <= fStack_9bc) & auVar142._12_4_;
            uVar52 = movmskps((int)uVar60,auVar95);
            uVar60 = (ulong)uVar52;
            if (uVar52 != 0) {
              auVar96._0_4_ = auVar95._0_4_ & -(uint)(auVar147._0_4_ != 0.0);
              auVar96._4_4_ = auVar95._4_4_ & -(uint)(auVar147._4_4_ != 0.0);
              auVar96._8_4_ = auVar95._8_4_ & -(uint)(auVar147._8_4_ != 0.0);
              auVar96._12_4_ = auVar95._12_4_ & -(uint)(auVar147._12_4_ != 0.0);
              uVar52 = movmskps(uVar52,auVar96);
              uVar60 = (ulong)uVar52;
              if (uVar52 != 0) {
                auVar51._4_4_ = fStack_844;
                auVar51._0_4_ = local_848;
                auVar51._8_4_ = fStack_840;
                auVar51._12_4_ = fStack_83c;
                local_988._8_8_ = uStack_850;
                local_988._0_8_ = local_858;
                auVar91 = rcpps(auVar113,auVar51);
                fVar110 = auVar91._0_4_;
                fVar119 = auVar91._4_4_;
                fVar150 = auVar91._8_4_;
                fVar129 = auVar91._12_4_;
                fVar90 = (float)DAT_01feca10;
                fVar108 = DAT_01feca10._4_4_;
                fVar109 = DAT_01feca10._12_4_;
                fVar161 = DAT_01feca10._8_4_;
                fVar110 = (float)(-(uint)(1e-18 <= ABS(local_848)) &
                                 (uint)((fVar90 - local_848 * fVar110) * fVar110 + fVar110));
                fVar119 = (float)(-(uint)(1e-18 <= ABS(fStack_844)) &
                                 (uint)((fVar108 - fStack_844 * fVar119) * fVar119 + fVar119));
                fVar150 = (float)(-(uint)(1e-18 <= ABS(fStack_840)) &
                                 (uint)((fVar161 - fStack_840 * fVar150) * fVar150 + fVar150));
                fVar129 = (float)(-(uint)(1e-18 <= ABS(fStack_83c)) &
                                 (uint)((fVar109 - fStack_83c * fVar129) * fVar129 + fVar129));
                auVar169._0_4_ = fVar168 * fVar110;
                auVar169._4_4_ = fVar171 * fVar119;
                auVar169._8_4_ = fVar172 * fVar150;
                auVar169._12_4_ = fVar173 * fVar129;
                auVar122 = minps(auVar169,_DAT_01feca10);
                auVar126._0_4_ = fVar110 * local_838;
                auVar126._4_4_ = fVar119 * fStack_834;
                auVar126._8_4_ = fVar150 * fStack_830;
                auVar126._12_4_ = fVar129 * fStack_82c;
                auVar91 = minps(auVar126,_DAT_01feca10);
                auVar97._0_4_ = fVar90 - auVar122._0_4_;
                auVar97._4_4_ = fVar108 - auVar122._4_4_;
                auVar97._8_4_ = fVar161 - auVar122._8_4_;
                auVar97._12_4_ = fVar109 - auVar122._12_4_;
                auVar114._0_4_ = fVar90 - auVar91._0_4_;
                auVar114._4_4_ = fVar108 - auVar91._4_4_;
                auVar114._8_4_ = fVar161 - auVar91._8_4_;
                auVar114._12_4_ = fVar109 - auVar91._12_4_;
                local_9e8 = blendvps(auVar122,auVar97,local_988);
                local_9d8 = blendvps(auVar91,auVar114,local_988);
                uVar65 = (ulong)(byte)uVar52;
                local_b98 = *(undefined8 *)pfVar20;
                fStack_b3c = fStack_b40;
                scene = pSVar67;
                do {
                  uVar68 = 0;
                  if (uVar65 != 0) {
                    for (; (uVar65 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
                    }
                  }
                  local_918 = *(uint *)(lVar33 + 0x40 + uVar68 * 4);
                  pGVar31 = (pSVar67->geometries).items[local_918].ptr;
                  if ((pGVar31->mask & *(uint *)(ray + local_ca8 * 4 + 0x90)) == 0) {
                    uVar65 = uVar65 ^ 1L << (uVar68 & 0x3f);
                    uVar60 = CONCAT71((uint7)(uint3)(*(uint *)(ray + local_ca8 * 4 + 0x90) >> 8),1);
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar60 = 0;
                  }
                  else {
                    uVar59 = *(undefined4 *)(ray + local_ca8 * 4 + 0x80);
                    local_948 = *(undefined4 *)(local_9e8 + uVar68 * 4);
                    uVar28 = *(undefined4 *)(local_9d8 + uVar68 * 4);
                    *(undefined4 *)(ray + local_ca8 * 4 + 0x80) =
                         *(undefined4 *)(local_9c8 + uVar68 * 4);
                    args.context = context->user;
                    uVar29 = *(undefined4 *)(lVar33 + 0x50 + uVar68 * 4);
                    local_928._4_4_ = uVar29;
                    local_928._0_4_ = uVar29;
                    local_928._8_4_ = uVar29;
                    local_928._12_4_ = uVar29;
                    local_938._4_4_ = uVar28;
                    local_938._0_4_ = uVar28;
                    local_938._8_4_ = uVar28;
                    local_938._12_4_ = uVar28;
                    local_978 = *(undefined4 *)(local_9b8 + uVar68 * 4);
                    local_968 = *(undefined4 *)(local_9a8 + uVar68 * 4);
                    local_958 = *(undefined4 *)(local_998 + uVar68 * 4);
                    uStack_974 = local_978;
                    uStack_970 = local_978;
                    uStack_96c = local_978;
                    uStack_964 = local_968;
                    uStack_960 = local_968;
                    uStack_95c = local_968;
                    uStack_954 = local_958;
                    uStack_950 = local_958;
                    uStack_94c = local_958;
                    uStack_944 = local_948;
                    uStack_940 = local_948;
                    uStack_93c = local_948;
                    uStack_914 = local_918;
                    uStack_910 = local_918;
                    uStack_90c = local_918;
                    local_908 = (args.context)->instID[0];
                    uStack_904 = local_908;
                    uStack_900 = local_908;
                    uStack_8fc = local_908;
                    local_8f8 = (args.context)->instPrimID[0];
                    uStack_8f4 = local_8f8;
                    uStack_8f0 = local_8f8;
                    uStack_8ec = local_8f8;
                    local_ba8 = *local_b00;
                    args.valid = (int *)local_ba8;
                    args.geometryUserPtr = pGVar31->userPtr;
                    args.hit = (RTCHitN *)&local_978;
                    args.N = 4;
                    pRVar55 = (RTCRayN *)pGVar31->occlusionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar55 != (RTCRayN *)0x0) {
                      pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                      pSVar67 = scene;
                    }
                    if (local_ba8 == (undefined1  [16])0x0) {
                      auVar98._8_4_ = 0xffffffff;
                      auVar98._0_8_ = 0xffffffffffffffff;
                      auVar98._12_4_ = 0xffffffff;
                      auVar98 = auVar98 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var39 = context->args->filter;
                      if ((p_Var39 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var39)(&args);
                        pSVar67 = scene;
                      }
                      auVar84._0_4_ = -(uint)(local_ba8._0_4_ == 0);
                      auVar84._4_4_ = -(uint)(local_ba8._4_4_ == 0);
                      auVar84._8_4_ = -(uint)(local_ba8._8_4_ == 0);
                      auVar84._12_4_ = -(uint)(local_ba8._12_4_ == 0);
                      auVar98 = auVar84 ^ _DAT_01febe20;
                      auVar91 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar84);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar91;
                      pRVar55 = args.ray;
                    }
                    auVar99._0_4_ = auVar98._0_4_ << 0x1f;
                    auVar99._4_4_ = auVar98._4_4_ << 0x1f;
                    auVar99._8_4_ = auVar98._8_4_ << 0x1f;
                    auVar99._12_4_ = auVar98._12_4_ << 0x1f;
                    iVar63 = movmskps((int)pRVar55,auVar99);
                    uVar60 = (ulong)CONCAT31((int3)((uint)iVar63 >> 8),iVar63 == 0);
                    if (iVar63 == 0) {
                      *(undefined4 *)(ray + local_ca8 * 4 + 0x80) = uVar59;
                      uVar65 = uVar65 ^ 1L << (uVar68 & 0x3f);
                    }
                  }
                  if ((char)uVar60 == '\0') goto LAB_0029cda2;
                } while (uVar65 != 0);
              }
            }
          }
          local_a98 = (float)uVar48;
          fStack_a94 = (float)((ulong)uVar48 >> 0x20);
          fStack_a90 = (float)uVar49;
          fVar161 = *(float *)(ray + local_ca8 * 4);
          fVar110 = *(float *)(ray + local_ca8 * 4 + 0x10);
          fVar119 = *(float *)(ray + local_ca8 * 4 + 0x20);
          fVar155 = (local_a98 * local_8b8 + (float)local_b98 * local_868) - fVar161;
          fVar156 = ((float)local_8c8 * fStack_8b4 + (float)local_b88 * fStack_864) - fVar161;
          fVar159 = ((float)local_8d8 * fStack_8b0 + (float)local_b78 * fStack_860) - fVar161;
          fVar160 = ((float)local_b68 * fStack_8ac + (float)local_b58 * fStack_85c) - fVar161;
          fVar117 = (fStack_a94 * local_8b8 + local_b98._4_4_ * local_868) - fVar110;
          fVar118 = (local_8c8._4_4_ * fStack_8b4 + local_b88._4_4_ * fStack_864) - fVar110;
          fStack_b40 = (local_8d8._4_4_ * fStack_8b0 + local_b78._4_4_ * fStack_860) - fVar110;
          fStack_b3c = (local_b68._4_4_ * fStack_8ac + local_b58._4_4_ * fStack_85c) - fVar110;
          fVar120 = (fStack_a90 * local_8b8 + fStack_b90 * local_868) - fVar119;
          fVar128 = ((float)uStack_8c0 * fStack_8b4 + (float)uStack_b80 * fStack_864) - fVar119;
          fVar130 = ((float)uStack_8d0 * fStack_8b0 + (float)uStack_b70 * fStack_860) - fVar119;
          fVar136 = ((float)uStack_b60 * fStack_8ac + (float)uStack_b50 * fStack_85c) - fVar119;
          fVar111 = local_8a8 - fVar161;
          fVar137 = fStack_8a4 - fVar161;
          fVar138 = fStack_8a0 - fVar161;
          fVar144 = fStack_89c - fVar161;
          fVar188 = local_898 - fVar110;
          fVar192 = fStack_894 - fVar110;
          fVar197 = fStack_890 - fVar110;
          fVar203 = fStack_88c - fVar110;
          fVar167 = fVar167 - fVar119;
          fVar170 = fVar170 - fVar119;
          fVar139 = fStack_c80 - fVar119;
          fVar145 = fStack_c7c - fVar119;
          fVar199 = local_878 - fVar161;
          fVar204 = fStack_874 - fVar161;
          fVar207 = fStack_870 - fVar161;
          fVar161 = fStack_86c - fVar161;
          fVar187 = local_888 - fVar110;
          fVar190 = fStack_884 - fVar110;
          fVar193 = fStack_880 - fVar110;
          fVar110 = fStack_87c - fVar110;
          fVar208 = local_b28 - fVar119;
          fVar209 = fStack_b24 - fVar119;
          fVar181 = fStack_b20 - fVar119;
          fVar119 = fStack_b1c - fVar119;
          fVar146 = fVar199 - fVar155;
          fVar151 = fVar204 - fVar156;
          fStack_b20 = fVar207 - fVar159;
          fStack_b1c = fVar161 - fVar160;
          fVar179 = fVar187 - fVar117;
          fVar180 = fVar190 - fVar118;
          fStack_b90 = fVar193 - fStack_b40;
          fStack_b8c = fVar110 - fStack_b3c;
          fVar153 = fVar208 - fVar120;
          fVar154 = fVar209 - fVar128;
          fStack_b30 = fVar181 - fVar130;
          fStack_b2c = fVar119 - fVar136;
          _local_b28 = CONCAT44(fVar151,fVar146);
          scene = (Scene *)CONCAT44(fVar154,fVar153);
          fStack_cc0 = *(float *)(ray + local_ca8 * 4 + 0x50);
          local_b98 = CONCAT44(fVar180,fVar179);
          fStack_c80 = *(float *)(ray + local_ca8 * 4 + 0x60);
          fVar150 = *(float *)(ray + local_ca8 * 4 + 0x40);
          fVar182 = (fVar179 * (fVar208 + fVar120) - (fVar187 + fVar117) * fVar153) * fVar150 +
                    ((fVar199 + fVar155) * fVar153 - (fVar208 + fVar120) * fVar146) * fStack_cc0 +
                    (fVar146 * (fVar187 + fVar117) - (fVar199 + fVar155) * fVar179) * fStack_c80;
          fVar183 = (fVar180 * (fVar209 + fVar128) - (fVar190 + fVar118) * fVar154) * fVar150 +
                    ((fVar204 + fVar156) * fVar154 - (fVar209 + fVar128) * fVar151) * fStack_cc0 +
                    (fVar151 * (fVar190 + fVar118) - (fVar204 + fVar156) * fVar180) * fStack_c80;
          fVar185 = (fStack_b90 * (fVar181 + fVar130) - (fVar193 + fStack_b40) * fStack_b30) *
                    fVar150 + ((fVar207 + fVar159) * fStack_b30 - (fVar181 + fVar130) * fStack_b20)
                              * fStack_cc0 +
                              (fStack_b20 * (fVar193 + fStack_b40) -
                              (fVar207 + fVar159) * fStack_b90) * fStack_c80;
          fVar186 = (fStack_b8c * (fVar119 + fVar136) - (fVar110 + fStack_b3c) * fStack_b2c) *
                    fVar150 + ((fVar161 + fVar160) * fStack_b2c - (fVar119 + fVar136) * fStack_b1c)
                              * fStack_cc0 +
                              (fStack_b1c * (fVar110 + fStack_b3c) -
                              (fVar161 + fVar160) * fStack_b8c) * fStack_c80;
          local_b18 = fVar155 - fVar111;
          fStack_b14 = fVar156 - fVar137;
          fStack_b10 = fVar159 - fVar138;
          fStack_b0c = fVar160 - fVar144;
          fVar168 = fVar117 - fVar188;
          fVar172 = fVar118 - fVar192;
          fVar175 = fStack_b40 - fVar197;
          fVar177 = fStack_b3c - fVar203;
          fVar189 = fVar120 - fVar167;
          fVar194 = fVar128 - fVar170;
          fVar198 = fVar130 - fVar139;
          fVar205 = fVar136 - fVar145;
          _local_b48 = CONCAT44(fVar118,fVar117);
          local_b58 = CONCAT44(fVar156,fVar155);
          uStack_b50 = CONCAT44(fVar160,fVar159);
          local_b68 = CONCAT44(fVar194,fVar189);
          uStack_b60 = CONCAT44(fVar205,fVar198);
          local_b78 = CONCAT44(fVar172,fVar168);
          uStack_b70 = CONCAT44(fVar177,fVar175);
          auVar148._0_4_ =
               (fVar168 * (fVar120 + fVar167) - (fVar117 + fVar188) * fVar189) * fVar150 +
               ((fVar155 + fVar111) * fVar189 - (fVar120 + fVar167) * local_b18) * fStack_cc0 +
               (local_b18 * (fVar117 + fVar188) - (fVar155 + fVar111) * fVar168) * fStack_c80;
          auVar148._4_4_ =
               (fVar172 * (fVar128 + fVar170) - (fVar118 + fVar192) * fVar194) * fVar150 +
               ((fVar156 + fVar137) * fVar194 - (fVar128 + fVar170) * fStack_b14) * fStack_cc0 +
               (fStack_b14 * (fVar118 + fVar192) - (fVar156 + fVar137) * fVar172) * fStack_c80;
          auVar148._8_4_ =
               (fVar175 * (fVar130 + fVar139) - (fStack_b40 + fVar197) * fVar198) * fVar150 +
               ((fVar159 + fVar138) * fVar198 - (fVar130 + fVar139) * fStack_b10) * fStack_cc0 +
               (fStack_b10 * (fStack_b40 + fVar197) - (fVar159 + fVar138) * fVar175) * fStack_c80;
          auVar148._12_4_ =
               (fVar177 * (fVar136 + fVar145) - (fStack_b3c + fVar203) * fVar205) * fVar150 +
               ((fVar160 + fVar144) * fVar205 - (fVar136 + fVar145) * fStack_b0c) * fStack_cc0 +
               (fStack_b0c * (fStack_b3c + fVar203) - (fVar160 + fVar144) * fVar177) * fStack_c80;
          fVar129 = fVar111 - fVar199;
          fVar90 = fVar137 - fVar204;
          fVar108 = fVar138 - fVar207;
          fVar109 = fVar144 - fVar161;
          fVar171 = fVar188 - fVar187;
          fVar173 = fVar192 - fVar190;
          fVar176 = fVar197 - fVar193;
          fVar178 = fVar203 - fVar110;
          fVar191 = fVar167 - fVar208;
          fVar195 = fVar170 - fVar209;
          fVar202 = fVar139 - fVar181;
          fVar206 = fVar145 - fVar119;
          auVar85._0_4_ =
               (fVar171 * (fVar208 + fVar167) - (fVar187 + fVar188) * fVar191) * fVar150 +
               ((fVar199 + fVar111) * fVar191 - (fVar208 + fVar167) * fVar129) * fStack_cc0 +
               (fVar129 * (fVar187 + fVar188) - (fVar199 + fVar111) * fVar171) * fStack_c80;
          auVar85._4_4_ =
               (fVar173 * (fVar209 + fVar170) - (fVar190 + fVar192) * fVar195) * fVar150 +
               ((fVar204 + fVar137) * fVar195 - (fVar209 + fVar170) * fVar90) * fStack_cc0 +
               (fVar90 * (fVar190 + fVar192) - (fVar204 + fVar137) * fVar173) * fStack_c80;
          auVar85._8_4_ =
               (fVar176 * (fVar181 + fVar139) - (fVar193 + fVar197) * fVar202) * fVar150 +
               ((fVar207 + fVar138) * fVar202 - (fVar181 + fVar139) * fVar108) * fStack_cc0 +
               (fVar108 * (fVar193 + fVar197) - (fVar207 + fVar138) * fVar176) * fStack_c80;
          auVar85._12_4_ =
               (fVar178 * (fVar119 + fVar145) - (fVar110 + fVar203) * fVar206) * fVar150 +
               ((fVar161 + fVar144) * fVar206 - (fVar119 + fVar145) * fVar109) * fStack_cc0 +
               (fVar109 * (fVar110 + fVar203) - (fVar161 + fVar144) * fVar178) * fStack_c80;
          fVar167 = fVar182 + auVar148._0_4_ + auVar85._0_4_;
          fVar170 = fVar183 + auVar148._4_4_ + auVar85._4_4_;
          fVar137 = fVar185 + auVar148._8_4_ + auVar85._8_4_;
          fVar138 = fVar186 + auVar148._12_4_ + auVar85._12_4_;
          auVar100._8_4_ = fVar185;
          auVar100._0_8_ = CONCAT44(fVar183,fVar182);
          auVar100._12_4_ = fVar186;
          auVar91 = minps(auVar100,auVar148);
          auVar91 = minps(auVar91,auVar85);
          auVar133._8_4_ = fVar185;
          auVar133._0_8_ = CONCAT44(fVar183,fVar182);
          auVar133._12_4_ = fVar186;
          auVar122 = maxps(auVar133,auVar148);
          auVar122 = maxps(auVar122,auVar85);
          fVar161 = ABS(fVar167) * 1.1920929e-07;
          fVar110 = ABS(fVar170) * 1.1920929e-07;
          fVar119 = ABS(fVar137) * 1.1920929e-07;
          fVar111 = ABS(fVar138) * 1.1920929e-07;
          auVar134._4_4_ = -(uint)(auVar122._4_4_ <= fVar110);
          auVar134._0_4_ = -(uint)(auVar122._0_4_ <= fVar161);
          auVar134._8_4_ = -(uint)(auVar122._8_4_ <= fVar119);
          auVar134._12_4_ = -(uint)(auVar122._12_4_ <= fVar111);
          auVar101._4_4_ = -(uint)(-fVar110 <= auVar91._4_4_);
          auVar101._0_4_ = -(uint)(-fVar161 <= auVar91._0_4_);
          auVar101._8_4_ = -(uint)(-fVar119 <= auVar91._8_4_);
          auVar101._12_4_ = -(uint)(-fVar111 <= auVar91._12_4_);
          auVar134 = auVar134 | auVar101;
          iVar63 = movmskps((int)uVar60,auVar134);
          fStack_cbc = fStack_cc0;
          fStack_c7c = fStack_c80;
          if (iVar63 != 0) {
            local_b88 = CONCAT44(fVar173,fVar171);
            uStack_b80 = CONCAT44(fVar178,fVar176);
            auVar165._0_4_ = fVar179 * fVar189 - fVar168 * fVar153;
            auVar165._4_4_ = fVar180 * fVar194 - fVar172 * fVar154;
            auVar165._8_4_ = fStack_b90 * fVar198 - fVar175 * fStack_b30;
            auVar165._12_4_ = fStack_b8c * fVar205 - fVar177 * fStack_b2c;
            auVar143._0_4_ = fVar168 * fVar191 - fVar171 * fVar189;
            auVar143._4_4_ = fVar172 * fVar195 - fVar173 * fVar194;
            auVar143._8_4_ = fVar175 * fVar202 - fVar176 * fVar198;
            auVar143._12_4_ = fVar177 * fVar206 - fVar178 * fVar205;
            auVar86._4_4_ = -(uint)(ABS(fVar172 * fVar154) < ABS(fVar173 * fVar194));
            auVar86._0_4_ = -(uint)(ABS(fVar168 * fVar153) < ABS(fVar171 * fVar189));
            auVar86._8_4_ = -(uint)(ABS(fVar175 * fStack_b30) < ABS(fVar176 * fVar198));
            auVar86._12_4_ = -(uint)(ABS(fVar177 * fStack_b2c) < ABS(fVar178 * fVar205));
            local_9b8 = blendvps(auVar143,auVar165,auVar86);
            auVar127._0_4_ = fVar153 * local_b18 - fVar146 * fVar189;
            auVar127._4_4_ = fVar154 * fStack_b14 - fVar151 * fVar194;
            auVar127._8_4_ = fStack_b30 * fStack_b10 - fStack_b20 * fVar198;
            auVar127._12_4_ = fStack_b2c * fStack_b0c - fStack_b1c * fVar205;
            auVar158._0_4_ = fVar129 * fVar189 - local_b18 * fVar191;
            auVar158._4_4_ = fVar90 * fVar194 - fStack_b14 * fVar195;
            auVar158._8_4_ = fVar108 * fVar198 - fStack_b10 * fVar202;
            auVar158._12_4_ = fVar109 * fVar205 - fStack_b0c * fVar206;
            auVar87._4_4_ = -(uint)(ABS(fVar151 * fVar194) < ABS(fStack_b14 * fVar195));
            auVar87._0_4_ = -(uint)(ABS(fVar146 * fVar189) < ABS(local_b18 * fVar191));
            auVar87._8_4_ = -(uint)(ABS(fStack_b20 * fVar198) < ABS(fStack_b10 * fVar202));
            auVar87._12_4_ = -(uint)(ABS(fStack_b1c * fVar205) < ABS(fStack_b0c * fVar206));
            local_9a8 = blendvps(auVar158,auVar127,auVar87);
            auVar149._0_4_ = local_b18 * fVar171 - fVar129 * fVar168;
            auVar149._4_4_ = fStack_b14 * fVar173 - fVar90 * fVar172;
            auVar149._8_4_ = fStack_b10 * fVar176 - fVar108 * fVar175;
            auVar149._12_4_ = fStack_b0c * fVar178 - fVar109 * fVar177;
            auVar88._4_4_ = -(uint)(ABS(fStack_b14 * fVar180) < ABS(fVar90 * fVar172));
            auVar88._0_4_ = -(uint)(ABS(local_b18 * fVar179) < ABS(fVar129 * fVar168));
            auVar88._8_4_ = -(uint)(ABS(fStack_b10 * fStack_b90) < ABS(fVar108 * fVar175));
            auVar88._12_4_ = -(uint)(ABS(fStack_b0c * fStack_b8c) < ABS(fVar109 * fVar177));
            auVar46._4_4_ = fVar151 * fVar172 - fStack_b14 * fVar180;
            auVar46._0_4_ = fVar146 * fVar168 - local_b18 * fVar179;
            auVar46._8_4_ = fStack_b20 * fVar175 - fStack_b10 * fStack_b90;
            auVar46._12_4_ = fStack_b1c * fVar177 - fStack_b0c * fStack_b8c;
            local_998 = blendvps(auVar149,auVar46,auVar88);
            fVar111 = fVar150 * local_9b8._0_4_ +
                      fStack_cc0 * local_9a8._0_4_ + fStack_c80 * local_998._0_4_;
            fVar139 = fVar150 * local_9b8._4_4_ +
                      fStack_cc0 * local_9a8._4_4_ + fStack_c80 * local_998._4_4_;
            fVar144 = fVar150 * local_9b8._8_4_ +
                      fStack_cc0 * local_9a8._8_4_ + fStack_c80 * local_998._8_4_;
            fVar145 = fVar150 * local_9b8._12_4_ +
                      fStack_cc0 * local_9a8._12_4_ + fStack_c80 * local_998._12_4_;
            fVar111 = fVar111 + fVar111;
            fVar139 = fVar139 + fVar139;
            fVar144 = fVar144 + fVar144;
            fVar145 = fVar145 + fVar145;
            auVar102._0_4_ = fVar117 * local_9a8._0_4_ + fVar120 * local_998._0_4_;
            auVar102._4_4_ = fVar118 * local_9a8._4_4_ + fVar128 * local_998._4_4_;
            auVar102._8_4_ = fStack_b40 * local_9a8._8_4_ + fVar130 * local_998._8_4_;
            auVar102._12_4_ = fStack_b3c * local_9a8._12_4_ + fVar136 * local_998._12_4_;
            fVar161 = fVar155 * local_9b8._0_4_ + auVar102._0_4_;
            fVar110 = fVar156 * local_9b8._4_4_ + auVar102._4_4_;
            fVar119 = fVar159 * local_9b8._8_4_ + auVar102._8_4_;
            fVar150 = fVar160 * local_9b8._12_4_ + auVar102._12_4_;
            auVar44._4_4_ = fVar139;
            auVar44._0_4_ = fVar111;
            auVar44._8_4_ = fVar144;
            auVar44._12_4_ = fVar145;
            auVar91 = rcpps(auVar102,auVar44);
            fVar129 = auVar91._0_4_;
            fVar90 = auVar91._4_4_;
            fVar108 = auVar91._8_4_;
            fVar109 = auVar91._12_4_;
            local_9c8._0_4_ = ((1.0 - fVar111 * fVar129) * fVar129 + fVar129) * (fVar161 + fVar161);
            local_9c8._4_4_ = ((1.0 - fVar139 * fVar90) * fVar90 + fVar90) * (fVar110 + fVar110);
            fStack_9c0 = ((1.0 - fVar144 * fVar108) * fVar108 + fVar108) * (fVar119 + fVar119);
            fStack_9bc = ((1.0 - fVar145 * fVar109) * fVar109 + fVar109) * (fVar150 + fVar150);
            fVar161 = *(float *)(ray + local_ca8 * 4 + 0x80);
            fVar110 = *(float *)(ray + local_ca8 * 4 + 0x30);
            auVar115._4_4_ = -(uint)(fVar110 <= (float)local_9c8._4_4_);
            auVar115._0_4_ = -(uint)(fVar110 <= (float)local_9c8._0_4_);
            auVar115._8_4_ = -(uint)(fVar110 <= fStack_9c0);
            auVar115._12_4_ = -(uint)(fVar110 <= fStack_9bc);
            auVar103._0_4_ =
                 -(uint)((float)local_9c8._0_4_ <= fVar161 && fVar110 <= (float)local_9c8._0_4_) &
                 auVar134._0_4_;
            auVar103._4_4_ =
                 -(uint)((float)local_9c8._4_4_ <= fVar161 && fVar110 <= (float)local_9c8._4_4_) &
                 auVar134._4_4_;
            auVar103._8_4_ =
                 -(uint)(fStack_9c0 <= fVar161 && fVar110 <= fStack_9c0) & auVar134._8_4_;
            auVar103._12_4_ =
                 -(uint)(fStack_9bc <= fVar161 && fVar110 <= fStack_9bc) & auVar134._12_4_;
            iVar63 = movmskps(iVar63,auVar103);
            if ((iVar63 != 0) &&
               (auVar104._0_4_ = auVar103._0_4_ & -(uint)(fVar111 != 0.0),
               auVar104._4_4_ = auVar103._4_4_ & -(uint)(fVar139 != 0.0),
               auVar104._8_4_ = auVar103._8_4_ & -(uint)(fVar144 != 0.0),
               auVar104._12_4_ = auVar103._12_4_ & -(uint)(fVar145 != 0.0),
               uVar52 = movmskps(iVar63,auVar104), uVar52 != 0)) {
              auVar50._4_4_ = fVar170;
              auVar50._0_4_ = fVar167;
              auVar50._8_4_ = fVar137;
              auVar50._12_4_ = fVar138;
              local_988 = local_8e8;
              pSVar67 = context->scene;
              auVar91 = rcpps(auVar115,auVar50);
              fVar110 = auVar91._0_4_;
              fVar119 = auVar91._4_4_;
              fVar150 = auVar91._8_4_;
              fVar129 = auVar91._12_4_;
              fVar90 = (float)DAT_01feca10;
              fVar108 = DAT_01feca10._4_4_;
              fVar109 = DAT_01feca10._12_4_;
              fVar161 = DAT_01feca10._8_4_;
              fVar110 = (float)(-(uint)(1e-18 <= ABS(fVar167)) &
                               (uint)((fVar90 - fVar167 * fVar110) * fVar110 + fVar110));
              fVar119 = (float)(-(uint)(1e-18 <= ABS(fVar170)) &
                               (uint)((fVar108 - fVar170 * fVar119) * fVar119 + fVar119));
              fVar150 = (float)(-(uint)(1e-18 <= ABS(fVar137)) &
                               (uint)((fVar161 - fVar137 * fVar150) * fVar150 + fVar150));
              fVar129 = (float)(-(uint)(1e-18 <= ABS(fVar138)) &
                               (uint)((fVar109 - fVar138 * fVar129) * fVar129 + fVar129));
              auVar135._0_4_ = fVar182 * fVar110;
              auVar135._4_4_ = fVar183 * fVar119;
              auVar135._8_4_ = fVar185 * fVar150;
              auVar135._12_4_ = fVar186 * fVar129;
              auVar91 = minps(auVar135,_DAT_01feca10);
              auVar200._0_4_ = fVar110 * auVar148._0_4_;
              auVar200._4_4_ = fVar119 * auVar148._4_4_;
              auVar200._8_4_ = fVar150 * auVar148._8_4_;
              auVar200._12_4_ = fVar129 * auVar148._12_4_;
              auVar122 = minps(auVar200,_DAT_01feca10);
              auVar105._0_4_ = fVar90 - auVar91._0_4_;
              auVar105._4_4_ = fVar108 - auVar91._4_4_;
              auVar105._8_4_ = fVar161 - auVar91._8_4_;
              auVar105._12_4_ = fVar109 - auVar91._12_4_;
              auVar116._0_4_ = fVar90 - auVar122._0_4_;
              auVar116._4_4_ = fVar108 - auVar122._4_4_;
              auVar116._8_4_ = fVar161 - auVar122._8_4_;
              auVar116._12_4_ = fVar109 - auVar122._12_4_;
              local_9e8 = blendvps(auVar91,auVar105,local_8e8);
              local_9d8 = blendvps(auVar122,auVar116,local_8e8);
              uVar60 = (ulong)(uVar52 & 0xff);
              do {
                uVar65 = 0;
                if (uVar60 != 0) {
                  for (; (uVar60 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
                  }
                }
                local_918 = *(uint *)(lVar33 + 0x40 + uVar65 * 4);
                pGVar31 = (pSVar67->geometries).items[local_918].ptr;
                if ((pGVar31->mask & *(uint *)(ray + local_ca8 * 4 + 0x90)) == 0) {
                  uVar60 = uVar60 ^ 1L << (uVar65 & 0x3f);
                  bVar77 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar77 = false;
                }
                else {
                  uVar59 = *(undefined4 *)(ray + local_ca8 * 4 + 0x80);
                  local_948 = *(undefined4 *)(local_9e8 + uVar65 * 4);
                  uVar28 = *(undefined4 *)(local_9d8 + uVar65 * 4);
                  *(undefined4 *)(ray + local_ca8 * 4 + 0x80) =
                       *(undefined4 *)(local_9c8 + uVar65 * 4);
                  args.context = context->user;
                  uVar29 = *(undefined4 *)(lVar33 + 0x50 + uVar65 * 4);
                  local_928._4_4_ = uVar29;
                  local_928._0_4_ = uVar29;
                  local_928._8_4_ = uVar29;
                  local_928._12_4_ = uVar29;
                  local_938._4_4_ = uVar28;
                  local_938._0_4_ = uVar28;
                  local_938._8_4_ = uVar28;
                  local_938._12_4_ = uVar28;
                  local_978 = *(undefined4 *)(local_9b8 + uVar65 * 4);
                  local_968 = *(undefined4 *)(local_9a8 + uVar65 * 4);
                  local_958 = *(undefined4 *)(local_998 + uVar65 * 4);
                  uStack_974 = local_978;
                  uStack_970 = local_978;
                  uStack_96c = local_978;
                  uStack_964 = local_968;
                  uStack_960 = local_968;
                  uStack_95c = local_968;
                  uStack_954 = local_958;
                  uStack_950 = local_958;
                  uStack_94c = local_958;
                  uStack_944 = local_948;
                  uStack_940 = local_948;
                  uStack_93c = local_948;
                  uStack_914 = local_918;
                  uStack_910 = local_918;
                  uStack_90c = local_918;
                  local_908 = (args.context)->instID[0];
                  uStack_904 = local_908;
                  uStack_900 = local_908;
                  uStack_8fc = local_908;
                  local_8f8 = (args.context)->instPrimID[0];
                  uStack_8f4 = local_8f8;
                  uStack_8f0 = local_8f8;
                  uStack_8ec = local_8f8;
                  local_ba8 = *local_b00;
                  args.valid = (int *)local_ba8;
                  args.geometryUserPtr = pGVar31->userPtr;
                  args.hit = (RTCHitN *)&local_978;
                  args.N = 4;
                  pRVar55 = (RTCRayN *)pGVar31->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar55 != (RTCRayN *)0x0) {
                    pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                  }
                  if (local_ba8 == (undefined1  [16])0x0) {
                    auVar106._8_4_ = 0xffffffff;
                    auVar106._0_8_ = 0xffffffffffffffff;
                    auVar106._12_4_ = 0xffffffff;
                    auVar106 = auVar106 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var39 = context->args->filter;
                    if ((p_Var39 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var39)(&args);
                    }
                    auVar89._0_4_ = -(uint)(local_ba8._0_4_ == 0);
                    auVar89._4_4_ = -(uint)(local_ba8._4_4_ == 0);
                    auVar89._8_4_ = -(uint)(local_ba8._8_4_ == 0);
                    auVar89._12_4_ = -(uint)(local_ba8._12_4_ == 0);
                    auVar106 = auVar89 ^ _DAT_01febe20;
                    auVar91 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar89
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar91;
                    pRVar55 = args.ray;
                  }
                  auVar107._0_4_ = auVar106._0_4_ << 0x1f;
                  auVar107._4_4_ = auVar106._4_4_ << 0x1f;
                  auVar107._8_4_ = auVar106._8_4_ << 0x1f;
                  auVar107._12_4_ = auVar106._12_4_ << 0x1f;
                  iVar63 = movmskps((int)pRVar55,auVar107);
                  bVar77 = iVar63 == 0;
                  if (bVar77) {
                    *(undefined4 *)(ray + local_ca8 * 4 + 0x80) = uVar59;
                    uVar60 = uVar60 ^ 1L << (uVar65 & 0x3f);
                  }
                }
                if (!bVar77) goto LAB_0029cda2;
              } while (uVar60 != 0);
            }
          }
          uVar53 = uVar53 + 1;
          bVar76 = uVar53 < uVar57;
          uVar60 = local_af8;
          uVar65 = local_ad8;
          uVar68 = local_ae0;
          uVar71 = local_af0;
          uVar74 = local_ae8;
        } while (uVar53 != uVar57);
      }
    }
    goto LAB_0029cd96;
  }
  goto LAB_0029cdee;
LAB_0029cda2:
  uVar60 = local_af8;
  uVar65 = local_ad8;
  uVar68 = local_ae0;
  uVar71 = local_af0;
  uVar74 = local_ae8;
  if (bVar76) {
    *(undefined4 *)(ray + local_ca8 * 4 + 0x80) = 0xff800000;
    uVar73 = 1;
  }
LAB_0029cd96:
  if ((uVar73 & 3) != 0) {
LAB_0029cdee:
    return pNVar64 != stack;
  }
  goto LAB_0029b3c6;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }